

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::iterate(WindingCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  TestLog *this_00;
  undefined4 extraout_var;
  char *pcVar6;
  ShaderProgram *this_01;
  MessageBuilder *pMVar7;
  int local_cac;
  MessageBuilder local_c30;
  MessageBuilder local_ab0;
  int local_92c;
  MessageBuilder local_928;
  int local_7a8;
  int local_7a4;
  MessageBuilder local_7a0;
  MessageBuilder local_620;
  RGBA local_49c;
  RGBA local_498;
  RGBA local_494;
  RGBA local_490;
  int local_48c;
  int local_488;
  int x;
  int y;
  int numRedPixels;
  int numWhitePixels;
  int badPixelTolerance;
  int totalNumPixels;
  allocator<char> local_449;
  string local_448;
  LogImage local_428;
  undefined1 local_398 [8];
  Surface rendered;
  MessageBuilder local_378;
  Winding local_1f4;
  undefined1 local_1f0 [4];
  int frontFaceWinding;
  byte local_59;
  undefined1 local_58 [7];
  bool success;
  VertexArray vao;
  Functions *gl;
  undefined1 local_30 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  WindingCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar6);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_30,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x40,0x40,dVar4
            );
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar4 = glu::ShaderProgram::getProgram(this_01);
  vao.super_ObjectWrapper._16_8_ = (**(code **)(*(long *)viewport._8_8_ + 0x18))();
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_58,(RenderContext *)viewport._8_8_);
  local_59 = 1;
  setViewport((Functions *)vao.super_ObjectWrapper._16_8_,(RandomViewport *)local_30);
  (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x1c0))(0x3f800000,0);
  (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x1680))(dVar4);
  (**(code **)(vao.super_ObjectWrapper._16_8_ + 0xfd8))(0x8e72,1);
  (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x5e0))(0xb44);
  pcVar1 = *(code **)(vao.super_ObjectWrapper._16_8_ + 0xd8);
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*pcVar1)(dVar4);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_1f0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1f0,(char (*) [21])"Face culling enabled");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1f0);
  for (local_1f4 = WINDING_CCW; (int)local_1f4 < 2; local_1f4 = local_1f4 + WINDING_CW) {
    tcu::TestLog::operator<<(&local_378,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [21])"Setting glFrontFace(");
    pcVar6 = "GL_CCW";
    if (local_1f4 == WINDING_CW) {
      pcVar6 = "GL_CW";
    }
    rendered.m_pixels.m_cap = (size_t)pcVar6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&rendered.m_pixels.m_cap);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_378);
    (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x6c0))(local_1f4 == WINDING_CW ^ 0x901);
    (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x188))(0x4000);
    (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x538))(0xe,0,1);
    dVar4 = (**(code **)(vao.super_ObjectWrapper._16_8_ + 0x800))();
    glu::checkError(dVar4,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0xb07);
    getPixels((Surface *)local_398,(RenderContext *)viewport._8_8_,(RandomViewport *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"RenderedImage",&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&totalNumPixels,"Rendered Image",
               (allocator<char> *)((long)&badPixelTolerance + 3));
    tcu::LogImage::LogImage
              (&local_428,&local_448,(string *)&totalNumPixels,(Surface *)local_398,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_00,&local_428);
    tcu::LogImage::~LogImage(&local_428);
    std::__cxx11::string::~string((string *)&totalNumPixels);
    std::allocator<char>::~allocator((allocator<char> *)((long)&badPixelTolerance + 3));
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    iVar3 = tcu::Surface::getWidth((Surface *)local_398);
    iVar5 = tcu::Surface::getHeight((Surface *)local_398);
    numWhitePixels = iVar3 * iVar5;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      iVar3 = tcu::Surface::getWidth((Surface *)local_398);
      iVar5 = tcu::Surface::getHeight((Surface *)local_398);
      local_cac = de::max<int>(iVar3,iVar5);
      local_cac = local_cac * 5;
    }
    else {
      local_cac = 0;
    }
    numRedPixels = local_cac;
    y = 0;
    x = 0;
    for (local_488 = 0; iVar3 = local_488, iVar5 = tcu::Surface::getHeight((Surface *)local_398),
        iVar3 < iVar5; local_488 = local_488 + 1) {
      for (local_48c = 0; iVar3 = local_48c, iVar5 = tcu::Surface::getWidth((Surface *)local_398),
          iVar3 < iVar5; local_48c = local_48c + 1) {
        local_490 = tcu::Surface::getPixel((Surface *)local_398,local_48c,local_488);
        local_494 = tcu::RGBA::white();
        bVar2 = tcu::RGBA::operator==(&local_490,&local_494);
        y = y + (uint)bVar2;
        local_498 = tcu::Surface::getPixel((Surface *)local_398,local_48c,local_488);
        local_49c = tcu::RGBA::red();
        bVar2 = tcu::RGBA::operator==(&local_498,&local_49c);
        x = (uint)bVar2 + x;
      }
    }
    tcu::TestLog::operator<<(&local_620,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_620,(char (*) [11])"Note: got ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&y);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])" white and ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&x);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])" red pixels");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_620);
    if (numRedPixels < (numWhitePixels - y) - x) {
      tcu::TestLog::operator<<(&local_7a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_7a0,(char (*) [14])"Failure: Got ");
      local_7a4 = (numWhitePixels - y) - x;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_7a4);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [52])
                                 " other than white or red pixels (maximum tolerance ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&numRedPixels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7a0);
      local_59 = 0;
      local_7a8 = 2;
    }
    else if (local_1f4 == this->m_winding) {
      if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        iVar3 = de::abs<int>(y - numWhitePixels / 2);
        if (numRedPixels < iVar3) {
          tcu::TestLog::operator<<(&local_928,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_928,
                              (char (*) [63])
                              "Failure: wrong number of white pixels; expected approximately ");
          local_92c = numWhitePixels / 2;
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_92c);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_928);
          local_59 = 0;
          local_7a8 = 2;
        }
        else {
LAB_02069545:
          local_7a8 = 0;
        }
      }
      else {
        if ((this->m_primitiveType != TESSPRIMITIVETYPE_QUADS) || (y == numWhitePixels))
        goto LAB_02069545;
        tcu::TestLog::operator<<(&local_ab0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_ab0,
                            (char (*) [57])
                            "Failure: expected only white pixels (full-viewport quad)");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_ab0);
        local_59 = 0;
        local_7a8 = 2;
      }
    }
    else {
      if (y == 0) goto LAB_02069545;
      tcu::TestLog::operator<<(&local_c30,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_c30,
                          (char (*) [54])"Failure: expected only red pixels (everything culled)");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c30);
      local_59 = 0;
      local_7a8 = 2;
    }
    tcu::Surface::~Surface((Surface *)local_398);
    if (local_7a8 != 0) break;
  }
  pcVar6 = "Image verification failed";
  if ((local_59 & 1) != 0) {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_59 & QP_TEST_RESULT_FAIL,pcVar6);
  local_7a8 = 1;
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_58);
  return STOP;
}

Assistant:

WindingCase::IterateResult WindingCase::iterate (void)
{
	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();
	const glu::VertexArray			vao							(renderCtx);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	gl.enable(GL_CULL_FACE);

	gl.bindVertexArray(*vao);

	log << TestLog::Message << "Face culling enabled" << TestLog::EndMessage;

	for (int frontFaceWinding = 0; frontFaceWinding < WINDING_LAST; frontFaceWinding++)
	{
		log << TestLog::Message << "Setting glFrontFace(" << (frontFaceWinding == WINDING_CW ? "GL_CW" : "GL_CCW") << ")" << TestLog::EndMessage;

		gl.frontFace(frontFaceWinding == WINDING_CW ? GL_CW : GL_CCW);

		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

		{
			const tcu::Surface rendered = getPixels(renderCtx, viewport);
			log << TestLog::Image("RenderedImage", "Rendered Image", rendered);

			{
				const int totalNumPixels		= rendered.getWidth()*rendered.getHeight();
				const int badPixelTolerance		= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 5*de::max(rendered.getWidth(), rendered.getHeight()) : 0;

				int numWhitePixels	= 0;
				int numRedPixels	= 0;
				for (int y = 0; y < rendered.getHeight();	y++)
				for (int x = 0; x < rendered.getWidth();	x++)
				{
					numWhitePixels	+= rendered.getPixel(x, y) == tcu::RGBA::white()	? 1 : 0;
					numRedPixels	+= rendered.getPixel(x, y) == tcu::RGBA::red()	? 1 : 0;
				}

				DE_ASSERT(numWhitePixels + numRedPixels <= totalNumPixels);

				log << TestLog::Message << "Note: got " << numWhitePixels << " white and " << numRedPixels << " red pixels" << TestLog::EndMessage;

				if (totalNumPixels - numWhitePixels - numRedPixels > badPixelTolerance)
				{
					log << TestLog::Message << "Failure: Got " << totalNumPixels - numWhitePixels - numRedPixels << " other than white or red pixels (maximum tolerance " << badPixelTolerance << ")" << TestLog::EndMessage;
					success = false;
					break;
				}

				if ((Winding)frontFaceWinding == m_winding)
				{
					if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					{
						if (de::abs(numWhitePixels - totalNumPixels/2) > badPixelTolerance)
						{
							log << TestLog::Message << "Failure: wrong number of white pixels; expected approximately " << totalNumPixels/2 << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
					{
						if (numWhitePixels != totalNumPixels)
						{
							log << TestLog::Message << "Failure: expected only white pixels (full-viewport quad)" << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else
						DE_ASSERT(false);
				}
				else
				{
					if (numWhitePixels != 0)
					{
						log << TestLog::Message << "Failure: expected only red pixels (everything culled)" << TestLog::EndMessage;
						success = false;
						break;
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image verification failed");
	return STOP;
}